

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-inquire.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Boolean BVar2;
  ulong uVar3;
  MA_AccessIndex index [10];
  Integer handle [10];
  MA_AccessIndex MStack_b8;
  MA_AccessIndex local_b0;
  MA_AccessIndex local_a8 [8];
  Integer local_68;
  Integer local_60;
  Integer local_58 [9];
  
  BVar2 = MA_init(0x3ec,20000,50000);
  if (BVar2 != 0) {
    printf("# initialized heap = %ld, stack = %ld\n",50000,20000);
    puts("# should see roughly the following values:");
    puts("#  MA_inquire_heap(MT_DBL)               = 50K");
    puts("#  MA_inquire_heap_check_stack(MT_DBL)   = 50K");
    puts("#  MA_inquire_heap_no_partition(MT_DBL)  = 70K");
    puts("#  MA_inquire_stack(MT_DBL)              = 20K");
    puts("#  MA_inquire_stack_check_heap(MT_DBL)   = 20K");
    puts("#  MA_inquire_stack_no_partition(MT_DBL) = 70K");
    print_inquire();
    puts("# allocate 2 heap (10K, 20K), 1 stack (35K)");
    MA_alloc_get(0x3ec,10000,"heap0",&local_68,&MStack_b8);
    MA_alloc_get(0x3ec,20000,"heap1",&local_60,&local_b0);
    MA_push_get(0x3ec,35000,"stack0",local_58,local_a8);
    puts("# free 1 heap (10K)");
    MA_free_heap(local_68);
    puts("# should see roughly the following values:");
    puts("#  MA_inquire_heap(MT_DBL)               = 20K");
    puts("#  MA_inquire_heap_check_stack(MT_DBL)   = 10K");
    puts("#  MA_inquire_heap_no_partition(MT_DBL)  = 10K");
    puts("#  MA_inquire_stack(MT_DBL)              = 0");
    puts("#  MA_inquire_stack_check_heap(MT_DBL)   = 0");
    puts("#  MA_inquire_stack_no_partition(MT_DBL) = 5K");
    print_inquire();
    return 0;
  }
  main_cold_1();
  puts("--------------------------------------------------------");
  uVar3 = MA_inquire_heap(0x3ec);
  printf("MA_inquire_heap(MT_DBL)               = %d\n",uVar3 & 0xffffffff);
  uVar3 = MA_inquire_heap_check_stack(0x3ec);
  printf("MA_inquire_heap_check_stack(MT_DBL)   = %d\n",uVar3 & 0xffffffff);
  uVar3 = MA_inquire_heap_no_partition(0x3ec);
  printf("MA_inquire_heap_no_partition(MT_DBL)  = %d\n",uVar3 & 0xffffffff);
  uVar3 = MA_inquire_stack(0x3ec);
  printf("MA_inquire_stack(MT_DBL)              = %d\n",uVar3 & 0xffffffff);
  uVar3 = MA_inquire_stack_check_heap(0x3ec);
  printf("MA_inquire_stack_check_heap(MT_DBL)   = %d\n",uVar3 & 0xffffffff);
  uVar3 = MA_inquire_stack_no_partition(0x3ec);
  printf("MA_inquire_stack_no_partition(MT_DBL) = %d\n",uVar3 & 0xffffffff);
  iVar1 = puts("--------------------------------------------------------");
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    Integer        units_heap;
    Integer        units_stack;
    Boolean        ok;
                  
    Integer        handle[MAXHANDLES];
    MA_AccessIndex index[MAXHANDLES];

    /* set sizes of heap and stack */
    units_heap = 50000;
    units_stack = 20000;

    /* initialize */
    ok = MA_init(MT_DBL, units_stack, units_heap);
    if (!ok)
    {
        (void)fprintf(stderr, "MA_init failed; punting\n");
        exit(1);
    }

    printf("# initialized heap = %ld, stack = %ld\n",
            (long)units_heap, (long)units_stack);

    printf("# should see roughly the following values:\n");
    printf("#  MA_inquire_heap(MT_DBL)               = 50K\n");
    printf("#  MA_inquire_heap_check_stack(MT_DBL)   = 50K\n");
    printf("#  MA_inquire_heap_no_partition(MT_DBL)  = 70K\n");
    printf("#  MA_inquire_stack(MT_DBL)              = 20K\n");
    printf("#  MA_inquire_stack_check_heap(MT_DBL)   = 20K\n");
    printf("#  MA_inquire_stack_no_partition(MT_DBL) = 70K\n");

    print_inquire();

    printf("# allocate 2 heap (10K, 20K), 1 stack (35K)\n");
    MA_alloc_get(MT_DBL, 10000, "heap0", &handle[0], &index[0]);
    MA_alloc_get(MT_DBL, 20000, "heap1", &handle[1], &index[1]);
    MA_push_get(MT_DBL, 35000, "stack0", &handle[2], &index[2]);

    printf("# free 1 heap (10K)\n");
    MA_free_heap(handle[0]);

    printf("# should see roughly the following values:\n");
    printf("#  MA_inquire_heap(MT_DBL)               = 20K\n");
    printf("#  MA_inquire_heap_check_stack(MT_DBL)   = 10K\n");
    printf("#  MA_inquire_heap_no_partition(MT_DBL)  = 10K\n");
    printf("#  MA_inquire_stack(MT_DBL)              = 0\n");
    printf("#  MA_inquire_stack_check_heap(MT_DBL)   = 0\n");
    printf("#  MA_inquire_stack_no_partition(MT_DBL) = 5K\n");

    print_inquire();

    return 0;
}